

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

size_t format_serialize(void *context,void *buffer,size_t size,char *time,uint64_t id,size_t line,
                       char *func,char *file,char *level,char *message,
                       metacall_log_custom_va_list args)

{
  int iVar1;
  undefined8 in_RCX;
  size_t in_RDX;
  char *in_RSI;
  ulong in_R8;
  undefined8 in_stack_00000010;
  va_list va;
  char *body;
  size_t length;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *local_40;
  long local_38;
  size_t local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = snprintf(in_RSI,in_RDX,"%.19s #%d %s:%d %s @%s ",in_RCX,in_R8 & 0xffffffff,
                   in_stack_00000010);
  local_38 = (long)iVar1;
  local_40 = local_10 + local_38;
  if (va[0].overflow_arg_area == (void *)0x0) {
    iVar1 = snprintf(local_40,local_18 - local_38,"%s",va[0]._0_8_);
    local_38 = iVar1 + local_38;
  }
  else {
    local_48 = *(undefined8 *)((long)va[0].overflow_arg_area + 0x10);
    local_58 = *va[0].overflow_arg_area;
    uStack_50 = *(undefined8 *)((long)va[0].overflow_arg_area + 8);
    iVar1 = vsnprintf(local_40,local_18 - local_38,(char *)va[0]._0_8_,&local_58);
    local_38 = iVar1 + local_38;
  }
  return local_38 + 1;
}

Assistant:

static size_t format_serialize(void *context, void *buffer, const size_t size, const char *time, uint64_t id, size_t line, const char *func, const char *file, const char *level, const char *message, metacall_log_custom_va_list args)
{
	size_t length = snprintf((char *)buffer, size, format, time, (int)id, file, (int)line, func, level);
	char *body = &(((char *)buffer)[length]);

	(void)context;

	if (args != NULL)
	{
		va_list va;

		va_copy(va, args->va);

		length += vsnprintf(body, size - length, message, va);

		va_end(va);
	}
	else
	{
		length += snprintf(body, size - length, "%s", message);
	}

	return length + 1;
}